

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_30c12::createDFDTestBaseComp<1U,_8U>::customize
          (createDFDTestBaseComp<1U,_8U> *this,ktx_uint8_t model,ktx_uint8_t primaries,
          ktx_uint8_t transfer,ktx_uint8_t flags,ktx_uint32_t dim0,ktx_uint32_t dim1,
          ktx_uint32_t dim2,
          initializer_list<(anonymous_namespace)::createDFDTestBase<1U,_8U>::sampleType> samples)

{
  undefined8 uVar1;
  const_iterator psVar2;
  undefined8 *puVar3;
  undefined4 in_ECX;
  undefined4 in_EDX;
  byte in_SIL;
  long in_RDI;
  byte in_R8B;
  uint in_R9D;
  uint in_stack_00000008;
  uint in_stack_00000010;
  sampleType sample;
  const_iterator __end0;
  const_iterator __begin0;
  initializer_list<(anonymous_namespace)::createDFDTestBase<1U,_8U>::sampleType> *__range2;
  uint32_t i;
  const_iterator local_28;
  uint local_14;
  
  *(ulong *)(in_RDI + 0x18) = *(ulong *)(in_RDI + 0x18) & 0xffffffffffffff00 | (ulong)in_SIL;
  *(ulong *)(in_RDI + 0x18) =
       *(ulong *)(in_RDI + 0x18) & 0xffffffffffff00ff | (ulong)(byte)in_EDX << 8;
  *(ulong *)(in_RDI + 0x18) =
       *(ulong *)(in_RDI + 0x18) & 0xffffffffff00ffff | (ulong)(byte)in_ECX << 0x10;
  *(ulong *)(in_RDI + 0x18) = *(ulong *)(in_RDI + 0x18) & 0xffffffff00ffffff | (ulong)in_R8B << 0x18
  ;
  *(ulong *)(in_RDI + 0x18) =
       *(ulong *)(in_RDI + 0x18) & 0xffffff00ffffffff | ((ulong)in_R9D & 0xff) << 0x20;
  *(ulong *)(in_RDI + 0x18) =
       *(ulong *)(in_RDI + 0x18) & 0xffff00ffffffffff | ((ulong)in_stack_00000008 & 0xff) << 0x28;
  *(ulong *)(in_RDI + 0x18) =
       *(ulong *)(in_RDI + 0x18) & 0xff00ffffffffffff | ((ulong)in_stack_00000010 & 0xff) << 0x30;
  local_14 = 0;
  local_28 = std::initializer_list<(anonymous_namespace)::createDFDTestBase<1U,_8U>::sampleType>::
             begin((initializer_list<(anonymous_namespace)::createDFDTestBase<1U,_8U>::sampleType> *
                   )&sample);
  psVar2 = std::initializer_list<(anonymous_namespace)::createDFDTestBase<1U,_8U>::sampleType>::end
                     ((initializer_list<(anonymous_namespace)::createDFDTestBase<1U,_8U>::sampleType>
                       *)CONCAT44(in_EDX,in_ECX));
  while( true ) {
    if (local_28 == psVar2) {
      return;
    }
    uVar1 = *(undefined8 *)&local_28->lower;
    puVar3 = (undefined8 *)(in_RDI + 0x28 + (ulong)local_14 * 0x10);
    *puVar3 = *(undefined8 *)local_28;
    puVar3[1] = uVar1;
    local_14 = local_14 + 1;
    if (local_14 == 1) break;
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void customize(ktx_uint8_t model,
                   ktx_uint8_t primaries, ktx_uint8_t transfer,
                   ktx_uint8_t flags,
                   ktx_uint32_t dim0, ktx_uint32_t dim1, ktx_uint32_t dim2,
                   std::initializer_list<sampleType> samples) {
        expected.model = model;
        expected.primaries = primaries;
        expected.transfer = transfer;
        expected.flags = flags;
        expected.texelBlockDimension0 = dim0;
        expected.texelBlockDimension1 = dim1;
        expected.texelBlockDimension2 = dim2;

        uint32_t i = 0; // There's got to be some syntax for declaring this in the for
        for (auto sample : samples ) {
            expected.samples[i] = sample;
            if (++i == numComponents)
                break;
        }
    }